

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O1

void os_remext(char *fn)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  sVar2 = strlen(fn);
  pcVar3 = fn + sVar2;
  while( true ) {
    if (pcVar3 <= fn) {
      return;
    }
    pcVar1 = pcVar3 + -1;
    if (*pcVar1 == '/') break;
    pcVar3 = pcVar3 + -1;
    if (*pcVar1 == '.') {
      *pcVar3 = '\0';
      return;
    }
  }
  return;
}

Assistant:

void os_remext(char *fn)
{
    char *p;

    /* scan backwards from the end of the string, looking for a dot */
    p = fn + strlen(fn);
    while ( p>fn )
    {
        /* move to the previous character */
        p--;

        /* if it's a period, we've found the extension */
        if ( *p=='.' )
        {
            /* terminate the string here to remove the extension */
            *p = '\0';

            /* we're done */
            return;
        }

        /* 
         *   if this is a path separator, there's no extension, so we can
         *   stop looking 
         */
        if (ispathchar(*p))
            return;
    }
}